

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExplosionDescriptor.cpp
# Opt level: O1

int __thiscall DIS::ExplosionDescriptor::getMarshalledSize(ExplosionDescriptor *this)

{
  int iVar1;
  
  iVar1 = EntityType::getMarshalledSize(&this->_explodingObject);
  return iVar1 + 8;
}

Assistant:

int ExplosionDescriptor::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + _explodingObject.getMarshalledSize();  // _explodingObject
   marshalSize = marshalSize + 2;  // _explosiveMaterial
   marshalSize = marshalSize + 2;  // _padding
   marshalSize = marshalSize + 4;  // _explosiveForce
    return marshalSize;
}